

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_table.c
# Opt level: O0

int objc_getClassList(Class *buffer,int bufferLen)

{
  bool bVar1;
  Class local_30;
  Class next;
  class_table_internal_table_enumerator *e;
  int count;
  int bufferLen_local;
  Class *buffer_local;
  
  if ((buffer == (Class *)0x0) || (bufferLen == 0)) {
    buffer_local._4_4_ = class_table->table_used;
  }
  else {
    e._0_4_ = 0;
    next = (Class)0x0;
    e._4_4_ = bufferLen;
    _count = buffer;
    while( true ) {
      bVar1 = false;
      if ((int)(uint)e < e._4_4_) {
        local_30 = (Class)class_table_internal_next
                                    (class_table,(class_table_internal_table_enumerator **)&next);
        bVar1 = local_30 != (Class)0x0;
      }
      if (!bVar1) break;
      _count[(int)(uint)e] = local_30;
      e._0_4_ = (uint)e + 1;
    }
    free(next);
    buffer_local._4_4_ = (uint)e;
  }
  return buffer_local._4_4_;
}

Assistant:

int objc_getClassList(Class *buffer, int bufferLen)
{
	if (buffer == NULL || bufferLen == 0)
	{
		return class_table->table_used;
	}
	int count = 0;
	struct class_table_internal_table_enumerator *e = NULL;
	Class next;
	while (count < bufferLen &&
		(next = class_table_internal_next(class_table, &e)))
	{
		buffer[count++] = next;
	}
	free(e);
	return count;
}